

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char cVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  vint4 ai;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vint4 ai_3;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 ai_1;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 bi_1;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 bi_3;
  undefined1 auVar39 [16];
  vint4 bi;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar20 = local_7d0;
  local_7d8 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar9 = fVar4 * 0.99999964;
  fVar10 = fVar5 * 0.99999964;
  fVar11 = fVar6 * 0.99999964;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  fVar6 = fVar6 * 1.0000004;
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar7 = (tray->tnear).field_0.i[k];
  auVar43._4_4_ = iVar7;
  auVar43._0_4_ = iVar7;
  auVar43._8_4_ = iVar7;
  auVar43._12_4_ = iVar7;
  iVar7 = (tray->tfar).field_0.i[k];
  auVar45._4_4_ = iVar7;
  auVar45._0_4_ = iVar7;
  auVar45._8_4_ = iVar7;
  auVar45._12_4_ = iVar7;
LAB_0058a535:
  bVar8 = puVar20 != &local_7d8;
  if (puVar20 == &local_7d8) {
    return bVar8;
  }
  uVar17 = puVar20[-1];
  puVar20 = puVar20 + -1;
LAB_0058a549:
  if ((uVar17 & 0xf) == 0) {
    auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar23),auVar47);
    auVar25._0_4_ = fVar9 * auVar26._0_4_;
    auVar25._4_4_ = fVar9 * auVar26._4_4_;
    auVar25._8_4_ = fVar9 * auVar26._8_4_;
    auVar25._12_4_ = fVar9 * auVar26._12_4_;
    auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar19),auVar48);
    auVar29._0_4_ = fVar10 * auVar26._0_4_;
    auVar29._4_4_ = fVar10 * auVar26._4_4_;
    auVar29._8_4_ = fVar10 * auVar26._8_4_;
    auVar29._12_4_ = fVar10 * auVar26._12_4_;
    auVar26 = vmaxps_avx(auVar25,auVar29);
    auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar22),auVar49);
    auVar30._0_4_ = fVar11 * auVar25._0_4_;
    auVar30._4_4_ = fVar11 * auVar25._4_4_;
    auVar30._8_4_ = fVar11 * auVar25._8_4_;
    auVar30._12_4_ = fVar11 * auVar25._12_4_;
    auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + (uVar23 ^ 0x10)),auVar47);
    auVar34._0_4_ = fVar4 * auVar25._0_4_;
    auVar34._4_4_ = fVar4 * auVar25._4_4_;
    auVar34._8_4_ = fVar4 * auVar25._8_4_;
    auVar34._12_4_ = fVar4 * auVar25._12_4_;
    auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + (uVar19 ^ 0x10)),auVar48);
    auVar36._0_4_ = fVar5 * auVar25._0_4_;
    auVar36._4_4_ = fVar5 * auVar25._4_4_;
    auVar36._8_4_ = fVar5 * auVar25._8_4_;
    auVar36._12_4_ = fVar5 * auVar25._12_4_;
    auVar33 = vminps_avx(auVar34,auVar36);
    auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + (uVar22 ^ 0x10)),auVar49);
    auVar37._0_4_ = fVar6 * auVar25._0_4_;
    auVar37._4_4_ = fVar6 * auVar25._4_4_;
    auVar37._8_4_ = fVar6 * auVar25._8_4_;
    auVar37._12_4_ = fVar6 * auVar25._12_4_;
    auVar25 = vmaxps_avx(auVar30,auVar43);
    auVar26 = vmaxps_avx(auVar26,auVar25);
    auVar25 = vminps_avx(auVar37,auVar45);
    auVar25 = vminps_avx(auVar33,auVar25);
    auVar26 = vcmpps_avx(auVar26,auVar25,2);
  }
  else {
    if ((int)(uVar17 & 0xf) != 2) {
      cVar14 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar17 & 0xfffffffffffffff0) * 0x40 + 0x28))
                         (pre,ray,k,context);
      if (cVar14 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        return bVar8;
      }
      goto LAB_0058a535;
    }
    uVar21 = uVar17 & 0xfffffffffffffff0;
    auVar26 = *(undefined1 (*) [16])(uVar21 + 0x80);
    auVar40._0_4_ = fVar3 * auVar26._0_4_;
    auVar40._4_4_ = fVar3 * auVar26._4_4_;
    auVar40._8_4_ = fVar3 * auVar26._8_4_;
    auVar40._12_4_ = fVar3 * auVar26._12_4_;
    auVar25 = *(undefined1 (*) [16])(uVar21 + 0x90);
    auVar42._0_4_ = fVar3 * auVar25._0_4_;
    auVar42._4_4_ = fVar3 * auVar25._4_4_;
    auVar42._8_4_ = fVar3 * auVar25._8_4_;
    auVar42._12_4_ = fVar3 * auVar25._12_4_;
    auVar44._0_4_ = fVar3 * *(float *)*(undefined1 (*) [16])(uVar21 + 0xa0);
    auVar44._4_4_ = fVar3 * *(float *)(uVar21 + 0xa4);
    auVar44._8_4_ = fVar3 * *(float *)(uVar21 + 0xa8);
    auVar44._12_4_ = fVar3 * *(float *)(uVar21 + 0xac);
    auVar12._4_4_ = uVar2;
    auVar12._0_4_ = uVar2;
    auVar12._8_4_ = uVar2;
    auVar12._12_4_ = uVar2;
    auVar33 = vfmadd231ps_fma(auVar40,auVar12,*(undefined1 (*) [16])(uVar21 + 0x50));
    auVar38 = vfmadd231ps_fma(auVar42,auVar12,*(undefined1 (*) [16])(uVar21 + 0x60));
    auVar13._4_4_ = uVar1;
    auVar13._0_4_ = uVar1;
    auVar13._8_4_ = uVar1;
    auVar13._12_4_ = uVar1;
    auVar40 = vfmadd231ps_fma(auVar33,auVar13,*(undefined1 (*) [16])(uVar21 + 0x20));
    auVar39 = vfmadd231ps_fma(auVar38,auVar13,*(undefined1 (*) [16])(uVar21 + 0x30));
    auVar46._8_4_ = 0x7fffffff;
    auVar46._0_8_ = 0x7fffffff7fffffff;
    auVar46._12_4_ = 0x7fffffff;
    auVar33 = vandps_avx(auVar46,auVar40);
    auVar31._8_4_ = 0x219392ef;
    auVar31._0_8_ = 0x219392ef219392ef;
    auVar31._12_4_ = 0x219392ef;
    auVar33 = vcmpps_avx(auVar33,auVar31,1);
    auVar38 = vblendvps_avx(auVar40,auVar31,auVar33);
    auVar33 = vandps_avx(auVar39,auVar46);
    auVar33 = vcmpps_avx(auVar33,auVar31,1);
    auVar40 = vblendvps_avx(auVar39,auVar31,auVar33);
    auVar33 = vfmadd231ps_fma(auVar44,auVar12,*(undefined1 (*) [16])(uVar21 + 0x70));
    auVar39 = vfmadd231ps_fma(auVar33,auVar13,*(undefined1 (*) [16])(uVar21 + 0x40));
    auVar33 = vandps_avx(auVar39,auVar46);
    auVar33 = vcmpps_avx(auVar33,auVar31,1);
    auVar33 = vblendvps_avx(auVar39,auVar31,auVar33);
    auVar39 = vrcpps_avx(auVar38);
    auVar27._8_4_ = 0x3f800000;
    auVar27._0_8_ = 0x3f8000003f800000;
    auVar27._12_4_ = 0x3f800000;
    auVar38 = vfnmadd213ps_fma(auVar38,auVar39,auVar27);
    auVar39 = vfmadd132ps_fma(auVar38,auVar39,auVar39);
    auVar38 = vrcpps_avx(auVar40);
    auVar40 = vfnmadd213ps_fma(auVar40,auVar38,auVar27);
    auVar40 = vfmadd132ps_fma(auVar40,auVar38,auVar38);
    auVar38 = vrcpps_avx(auVar33);
    auVar33 = vfnmadd213ps_fma(auVar33,auVar38,auVar27);
    auVar33 = vfmadd132ps_fma(auVar33,auVar38,auVar38);
    auVar26 = vfmadd213ps_fma(auVar26,auVar49,*(undefined1 (*) [16])(uVar21 + 0xb0));
    auVar38 = vfmadd231ps_fma(auVar26,auVar48,*(undefined1 (*) [16])(uVar21 + 0x50));
    auVar26 = vfmadd213ps_fma(auVar25,auVar49,*(undefined1 (*) [16])(uVar21 + 0xc0));
    auVar25 = vfmadd231ps_fma(auVar26,auVar48,*(undefined1 (*) [16])(uVar21 + 0x60));
    auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xa0),auVar49,
                              *(undefined1 (*) [16])(uVar21 + 0xd0));
    auVar26 = vfmadd231ps_fma(auVar26,auVar48,*(undefined1 (*) [16])(uVar21 + 0x70));
    auVar38 = vfmadd231ps_fma(auVar38,auVar47,*(undefined1 (*) [16])(uVar21 + 0x20));
    auVar35._0_4_ = auVar38._0_4_ * -auVar39._0_4_;
    auVar35._4_4_ = auVar38._4_4_ * -auVar39._4_4_;
    auVar35._8_4_ = auVar38._8_4_ * -auVar39._8_4_;
    auVar35._12_4_ = auVar38._12_4_ * -auVar39._12_4_;
    auVar25 = vfmadd231ps_fma(auVar25,auVar47,*(undefined1 (*) [16])(uVar21 + 0x30));
    auVar32._0_4_ = auVar25._0_4_ * -auVar40._0_4_;
    auVar32._4_4_ = auVar25._4_4_ * -auVar40._4_4_;
    auVar32._8_4_ = auVar25._8_4_ * -auVar40._8_4_;
    auVar32._12_4_ = auVar25._12_4_ * -auVar40._12_4_;
    auVar26 = vfmadd231ps_fma(auVar26,auVar47,*(undefined1 (*) [16])(uVar21 + 0x40));
    auVar28._0_4_ = auVar26._0_4_ * -auVar33._0_4_;
    auVar28._4_4_ = auVar26._4_4_ * -auVar33._4_4_;
    auVar28._8_4_ = auVar26._8_4_ * -auVar33._8_4_;
    auVar28._12_4_ = auVar26._12_4_ * -auVar33._12_4_;
    auVar38._0_4_ = auVar39._0_4_ + auVar35._0_4_;
    auVar38._4_4_ = auVar39._4_4_ + auVar35._4_4_;
    auVar38._8_4_ = auVar39._8_4_ + auVar35._8_4_;
    auVar38._12_4_ = auVar39._12_4_ + auVar35._12_4_;
    auVar39._0_4_ = auVar40._0_4_ + auVar32._0_4_;
    auVar39._4_4_ = auVar40._4_4_ + auVar32._4_4_;
    auVar39._8_4_ = auVar40._8_4_ + auVar32._8_4_;
    auVar39._12_4_ = auVar40._12_4_ + auVar32._12_4_;
    auVar41._0_4_ = auVar33._0_4_ + auVar28._0_4_;
    auVar41._4_4_ = auVar33._4_4_ + auVar28._4_4_;
    auVar41._8_4_ = auVar33._8_4_ + auVar28._8_4_;
    auVar41._12_4_ = auVar33._12_4_ + auVar28._12_4_;
    auVar26 = vpminsd_avx(auVar32,auVar39);
    auVar25 = vpminsd_avx(auVar28,auVar41);
    auVar26 = vmaxps_avx(auVar26,auVar25);
    auVar40 = vpminsd_avx(auVar35,auVar38);
    auVar38 = vpmaxsd_avx(auVar35,auVar38);
    auVar25 = vpmaxsd_avx(auVar32,auVar39);
    auVar33 = vpmaxsd_avx(auVar28,auVar41);
    auVar33 = vminps_avx(auVar25,auVar33);
    auVar25 = vmaxps_avx(auVar43,auVar40);
    auVar26 = vmaxps_avx(auVar25,auVar26);
    auVar25 = vminps_avx(auVar45,auVar38);
    auVar25 = vminps_avx(auVar25,auVar33);
    auVar33._0_4_ = auVar26._0_4_ * 0.99999964;
    auVar33._4_4_ = auVar26._4_4_ * 0.99999964;
    auVar33._8_4_ = auVar26._8_4_ * 0.99999964;
    auVar33._12_4_ = auVar26._12_4_ * 0.99999964;
    auVar26._0_4_ = auVar25._0_4_ * 1.0000004;
    auVar26._4_4_ = auVar25._4_4_ * 1.0000004;
    auVar26._8_4_ = auVar25._8_4_ * 1.0000004;
    auVar26._12_4_ = auVar25._12_4_ * 1.0000004;
    auVar26 = vcmpps_avx(auVar33,auVar26,2);
  }
  auVar26 = vpslld_avx(auVar26,0x1f);
  uVar15 = vmovmskps_avx(auVar26);
  if (uVar15 == 0) goto LAB_0058a535;
  uVar15 = uVar15 & 0xff;
  uVar21 = uVar17 & 0xfffffffffffffff0;
  lVar18 = 0;
  for (uVar17 = (ulong)uVar15; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
    lVar18 = lVar18 + 1;
  }
  uVar17 = *(ulong *)(uVar21 + lVar18 * 8);
  uVar15 = uVar15 - 1 & uVar15;
  uVar16 = (ulong)uVar15;
  if (uVar15 != 0) {
    *puVar20 = uVar17;
    lVar18 = 0;
    for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
      lVar18 = lVar18 + 1;
    }
    uVar15 = uVar15 - 1 & uVar15;
    uVar16 = (ulong)uVar15;
    bVar24 = uVar15 == 0;
    while( true ) {
      puVar20 = puVar20 + 1;
      uVar17 = *(ulong *)(uVar21 + lVar18 * 8);
      if (bVar24) break;
      *puVar20 = uVar17;
      lVar18 = 0;
      for (uVar17 = uVar16; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar16 = uVar16 - 1 & uVar16;
      bVar24 = uVar16 == 0;
    }
  }
  goto LAB_0058a549;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }